

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O2

double __thiscall chrono::ChConstraintTwoGeneric::Compute_Cq_q(ChConstraintTwoGeneric *this)

{
  ChVariables *pCVar1;
  double dVar2;
  Scalar SVar3;
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  local_40;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_30 [24];
  
  pCVar1 = (this->super_ChConstraintTwo).variables_a;
  dVar2 = 0.0;
  if (pCVar1->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)local_30,pCVar1);
    local_40 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&this->Cq_a,local_30);
    SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_40);
    dVar2 = SVar3 + 0.0;
  }
  pCVar1 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar1->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)local_30,pCVar1);
    local_40 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&this->Cq_b,local_30);
    SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_40);
    dVar2 = dVar2 + SVar3;
  }
  return dVar2;
}

Assistant:

double ChConstraintTwoGeneric::Compute_Cq_q() {
    double ret = 0;

    if (variables_a->IsActive()) {
        ret += Cq_a * variables_a->Get_qb();
    }

    if (variables_b->IsActive()) {
        ret += Cq_b * variables_b->Get_qb();
    }

    return ret;
}